

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  ulong uVar31;
  long lVar32;
  byte bVar33;
  int iVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  ulong *puVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  float fVar43;
  float fVar48;
  float fVar49;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar50;
  vint4 bi;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vint4 ai;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  float fVar77;
  undefined1 auVar76 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  float fVar83;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar84 [64];
  uint uVar89;
  uint uVar90;
  uint uVar91;
  undefined1 auVar88 [64];
  undefined1 auVar92 [64];
  float fVar93;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar99;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_a24;
  Scene *local_a20;
  undefined1 local_a18 [16];
  undefined1 local_a08 [16];
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  Geometry *local_9d0;
  ulong local_9c8;
  ulong local_9c0;
  long local_9b8;
  long local_9b0;
  undefined4 local_9a8;
  undefined4 local_9a4;
  undefined4 local_9a0;
  undefined4 local_99c;
  float local_998;
  undefined4 local_994;
  uint local_990;
  uint local_98c;
  uint local_988;
  RTCFilterFunctionNArguments local_978;
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8 != 8) {
    fVar43 = ray->tfar;
    if (0.0 <= fVar43) {
      puVar38 = local_7d0;
      aVar3 = (ray->dir).field_0;
      auVar44 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar75._8_4_ = 0x7fffffff;
      auVar75._0_8_ = 0x7fffffff7fffffff;
      auVar75._12_4_ = 0x7fffffff;
      auVar75 = vandps_avx((undefined1  [16])aVar3,auVar75);
      auVar78._8_4_ = 0x219392ef;
      auVar78._0_8_ = 0x219392ef219392ef;
      auVar78._12_4_ = 0x219392ef;
      auVar75 = vcmpps_avx(auVar75,auVar78,1);
      auVar75 = vblendvps_avx((undefined1  [16])aVar3,auVar78,auVar75);
      auVar78 = vrcpps_avx(auVar75);
      fVar48 = auVar78._0_4_;
      auVar71._0_4_ = fVar48 * auVar75._0_4_;
      fVar49 = auVar78._4_4_;
      auVar71._4_4_ = fVar49 * auVar75._4_4_;
      fVar50 = auVar78._8_4_;
      auVar71._8_4_ = fVar50 * auVar75._8_4_;
      fVar77 = auVar78._12_4_;
      auVar71._12_4_ = fVar77 * auVar75._12_4_;
      auVar79._8_4_ = 0x3f800000;
      auVar79._0_8_ = 0x3f8000003f800000;
      auVar79._12_4_ = 0x3f800000;
      auVar75 = vsubps_avx(auVar79,auVar71);
      auVar72._0_4_ = fVar48 + fVar48 * auVar75._0_4_;
      auVar72._4_4_ = fVar49 + fVar49 * auVar75._4_4_;
      auVar72._8_4_ = fVar50 + fVar50 * auVar75._8_4_;
      auVar72._12_4_ = fVar77 + fVar77 * auVar75._12_4_;
      uVar2 = *(undefined4 *)&(ray->org).field_0;
      local_8c8._4_4_ = uVar2;
      local_8c8._0_4_ = uVar2;
      local_8c8._8_4_ = uVar2;
      local_8c8._12_4_ = uVar2;
      auVar81 = ZEXT1664(local_8c8);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_8d8._4_4_ = uVar2;
      local_8d8._0_4_ = uVar2;
      local_8d8._8_4_ = uVar2;
      local_8d8._12_4_ = uVar2;
      auVar82 = ZEXT1664(local_8d8);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_8e8._4_4_ = uVar2;
      local_8e8._0_4_ = uVar2;
      local_8e8._8_4_ = uVar2;
      local_8e8._12_4_ = uVar2;
      auVar84 = ZEXT1664(local_8e8);
      local_8f8 = vshufps_avx(auVar72,auVar72,0);
      auVar88 = ZEXT1664(local_8f8);
      auVar75 = vmovshdup_avx(auVar72);
      local_908 = vshufps_avx(auVar72,auVar72,0x55);
      auVar92 = ZEXT1664(local_908);
      auVar78 = vshufpd_avx(auVar72,auVar72,1);
      local_918 = vshufps_avx(auVar72,auVar72,0xaa);
      auVar74 = ZEXT1664(local_918);
      uVar39 = (ulong)(auVar72._0_4_ < 0.0) << 4;
      uVar40 = (ulong)(auVar75._0_4_ < 0.0) << 4 | 0x20;
      uVar37 = (ulong)(auVar78._0_4_ < 0.0) << 4 | 0x40;
      uVar41 = uVar39 ^ 0x10;
      local_928 = vshufps_avx(auVar44,auVar44,0);
      auVar76 = ZEXT1664(local_928);
      local_938 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
      auVar80 = ZEXT1664(local_938);
      local_948 = mm_lookupmask_ps._240_16_;
LAB_002be589:
      do {
        uVar42 = puVar38[-1];
        puVar38 = puVar38 + -1;
        while ((uVar42 & 8) == 0) {
          auVar75 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + uVar39),auVar81._0_16_);
          auVar44._0_4_ = auVar88._0_4_ * auVar75._0_4_;
          auVar44._4_4_ = auVar88._4_4_ * auVar75._4_4_;
          auVar44._8_4_ = auVar88._8_4_ * auVar75._8_4_;
          auVar44._12_4_ = auVar88._12_4_ * auVar75._12_4_;
          auVar75 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + uVar40),auVar82._0_16_);
          auVar51._0_4_ = auVar92._0_4_ * auVar75._0_4_;
          auVar51._4_4_ = auVar92._4_4_ * auVar75._4_4_;
          auVar51._8_4_ = auVar92._8_4_ * auVar75._8_4_;
          auVar51._12_4_ = auVar92._12_4_ * auVar75._12_4_;
          auVar75 = vpmaxsd_avx(auVar44,auVar51);
          auVar44 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + uVar37),auVar84._0_16_);
          auVar52._0_4_ = auVar74._0_4_ * auVar44._0_4_;
          auVar52._4_4_ = auVar74._4_4_ * auVar44._4_4_;
          auVar52._8_4_ = auVar74._8_4_ * auVar44._8_4_;
          auVar52._12_4_ = auVar74._12_4_ * auVar44._12_4_;
          auVar44 = vpmaxsd_avx(auVar52,auVar76._0_16_);
          auVar75 = vpmaxsd_avx(auVar75,auVar44);
          auVar44 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + uVar41),auVar81._0_16_);
          auVar53._0_4_ = auVar88._0_4_ * auVar44._0_4_;
          auVar53._4_4_ = auVar88._4_4_ * auVar44._4_4_;
          auVar53._8_4_ = auVar88._8_4_ * auVar44._8_4_;
          auVar53._12_4_ = auVar88._12_4_ * auVar44._12_4_;
          auVar44 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + (uVar40 ^ 0x10)),
                               auVar82._0_16_);
          auVar63._0_4_ = auVar92._0_4_ * auVar44._0_4_;
          auVar63._4_4_ = auVar92._4_4_ * auVar44._4_4_;
          auVar63._8_4_ = auVar92._8_4_ * auVar44._8_4_;
          auVar63._12_4_ = auVar92._12_4_ * auVar44._12_4_;
          auVar44 = vpminsd_avx(auVar53,auVar63);
          auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + (uVar37 ^ 0x10)),
                               auVar84._0_16_);
          auVar64._0_4_ = auVar74._0_4_ * auVar78._0_4_;
          auVar64._4_4_ = auVar74._4_4_ * auVar78._4_4_;
          auVar64._8_4_ = auVar74._8_4_ * auVar78._8_4_;
          auVar64._12_4_ = auVar74._12_4_ * auVar78._12_4_;
          auVar78 = vpminsd_avx(auVar64,auVar80._0_16_);
          auVar44 = vpminsd_avx(auVar44,auVar78);
          auVar75 = vpcmpgtd_avx(auVar75,auVar44);
          iVar34 = vmovmskps_avx(auVar75);
          if (iVar34 == 0xf) {
            if (puVar38 == &local_7d8) {
              return;
            }
            goto LAB_002be589;
          }
          bVar33 = (byte)iVar34 ^ 0xf;
          uVar31 = uVar42 & 0xfffffffffffffff0;
          lVar32 = 0;
          if (bVar33 != 0) {
            for (; (bVar33 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
            }
          }
          uVar42 = *(ulong *)(uVar31 + lVar32 * 8);
          uVar36 = bVar33 - 1 & (uint)bVar33;
          if (uVar36 != 0) {
            *puVar38 = uVar42;
            puVar38 = puVar38 + 1;
            lVar32 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
              }
            }
            uVar42 = *(ulong *)(uVar31 + lVar32 * 8);
            uVar36 = uVar36 - 1 & uVar36;
            uVar35 = (ulong)uVar36;
            if (uVar36 != 0) {
              do {
                *puVar38 = uVar42;
                puVar38 = puVar38 + 1;
                lVar32 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                  }
                }
                uVar42 = *(ulong *)(uVar31 + lVar32 * 8);
                uVar35 = uVar35 & uVar35 - 1;
              } while (uVar35 != 0);
            }
          }
        }
        local_9b0 = (ulong)((uint)uVar42 & 0xf) - 8;
        if (local_9b0 != 0) {
          uVar42 = uVar42 & 0xfffffffffffffff0;
          local_a20 = context->scene;
          local_9b8 = 0;
          do {
            lVar32 = local_9b8 * 0x50;
            ppfVar4 = (local_a20->vertices).items;
            pfVar5 = ppfVar4[*(uint *)(uVar42 + 0x30 + lVar32)];
            pfVar6 = ppfVar4[*(uint *)(uVar42 + 0x34 + lVar32)];
            pfVar7 = ppfVar4[*(uint *)(uVar42 + 0x38 + lVar32)];
            pfVar8 = ppfVar4[*(uint *)(uVar42 + 0x3c + lVar32)];
            auVar78 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar42 + lVar32)),
                                    *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar42 + 8 + lVar32)))
            ;
            auVar75 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar42 + lVar32)),
                                    *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar42 + 8 + lVar32)))
            ;
            auVar71 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar42 + 4 + lVar32)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar42 + 0xc + lVar32)));
            auVar44 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar42 + 4 + lVar32)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar42 + 0xc + lVar32)));
            auVar79 = vunpcklps_avx(auVar75,auVar44);
            auVar51 = vunpcklps_avx(auVar78,auVar71);
            auVar72 = vunpckhps_avx(auVar78,auVar71);
            auVar78 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar42 + 0x10 + lVar32)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar42 + 0x18 + lVar32)));
            auVar75 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar42 + 0x10 + lVar32)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar42 + 0x18 + lVar32)));
            auVar71 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar42 + 0x14 + lVar32)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar42 + 0x1c + lVar32)));
            auVar44 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar42 + 0x14 + lVar32)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar42 + 0x1c + lVar32)));
            auVar52 = vunpcklps_avx(auVar75,auVar44);
            auVar53 = vunpcklps_avx(auVar78,auVar71);
            auVar75 = vunpckhps_avx(auVar78,auVar71);
            auVar71 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar42 + 0x20 + lVar32)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar42 + 0x28 + lVar32)));
            auVar44 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar42 + 0x20 + lVar32)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar42 + 0x28 + lVar32)));
            auVar63 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar42 + 0x24 + lVar32)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar42 + 0x2c + lVar32)));
            auVar78 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar42 + 0x24 + lVar32)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar42 + 0x2c + lVar32)));
            auVar64 = vunpcklps_avx(auVar44,auVar78);
            auVar44 = vunpcklps_avx(auVar71,auVar63);
            auVar78 = vunpckhps_avx(auVar71,auVar63);
            puVar1 = (undefined8 *)(uVar42 + 0x30 + lVar32);
            local_8a8 = *puVar1;
            uStack_8a0 = puVar1[1];
            puVar1 = (undefined8 *)(uVar42 + 0x40 + lVar32);
            local_8b8 = *puVar1;
            uStack_8b0 = puVar1[1];
            local_9f8 = vsubps_avx(auVar51,auVar53);
            local_a08 = vsubps_avx(auVar72,auVar75);
            auVar75 = vsubps_avx(auVar79,auVar52);
            auVar44 = vsubps_avx(auVar44,auVar51);
            auVar78 = vsubps_avx(auVar78,auVar72);
            auVar71 = vsubps_avx(auVar64,auVar79);
            fVar50 = auVar71._0_4_;
            fVar99 = local_a08._0_4_;
            auVar45._0_4_ = fVar99 * fVar50;
            fVar13 = auVar71._4_4_;
            fVar102 = local_a08._4_4_;
            auVar45._4_4_ = fVar102 * fVar13;
            fVar19 = auVar71._8_4_;
            fVar103 = local_a08._8_4_;
            auVar45._8_4_ = fVar103 * fVar19;
            fVar25 = auVar71._12_4_;
            fVar104 = local_a08._12_4_;
            auVar45._12_4_ = fVar104 * fVar25;
            fVar77 = auVar78._0_4_;
            fVar83 = auVar75._0_4_;
            auVar54._0_4_ = fVar83 * fVar77;
            fVar14 = auVar78._4_4_;
            fVar85 = auVar75._4_4_;
            auVar54._4_4_ = fVar85 * fVar14;
            fVar20 = auVar78._8_4_;
            fVar86 = auVar75._8_4_;
            auVar54._8_4_ = fVar86 * fVar20;
            fVar26 = auVar78._12_4_;
            fVar87 = auVar75._12_4_;
            auVar54._12_4_ = fVar87 * fVar26;
            local_808 = vsubps_avx(auVar54,auVar45);
            fVar9 = auVar44._0_4_;
            auVar55._0_4_ = fVar83 * fVar9;
            fVar15 = auVar44._4_4_;
            auVar55._4_4_ = fVar85 * fVar15;
            fVar21 = auVar44._8_4_;
            auVar55._8_4_ = fVar86 * fVar21;
            fVar27 = auVar44._12_4_;
            auVar55._12_4_ = fVar87 * fVar27;
            fVar93 = local_9f8._0_4_;
            auVar65._0_4_ = fVar93 * fVar50;
            fVar96 = local_9f8._4_4_;
            auVar65._4_4_ = fVar96 * fVar13;
            fVar97 = local_9f8._8_4_;
            auVar65._8_4_ = fVar97 * fVar19;
            fVar98 = local_9f8._12_4_;
            auVar65._12_4_ = fVar98 * fVar25;
            local_7f8 = vsubps_avx(auVar65,auVar55);
            auVar66._0_4_ = fVar93 * fVar77;
            auVar66._4_4_ = fVar96 * fVar14;
            auVar66._8_4_ = fVar97 * fVar20;
            auVar66._12_4_ = fVar98 * fVar26;
            auVar73._0_4_ = fVar99 * fVar9;
            auVar73._4_4_ = fVar102 * fVar15;
            auVar73._8_4_ = fVar103 * fVar21;
            auVar73._12_4_ = fVar104 * fVar27;
            local_a18 = vsubps_avx(auVar73,auVar66);
            uVar2 = *(undefined4 *)&(ray->org).field_0;
            auVar46._4_4_ = uVar2;
            auVar46._0_4_ = uVar2;
            auVar46._8_4_ = uVar2;
            auVar46._12_4_ = uVar2;
            uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar94._4_4_ = uVar2;
            auVar94._0_4_ = uVar2;
            auVar94._8_4_ = uVar2;
            auVar94._12_4_ = uVar2;
            uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar100._4_4_ = uVar2;
            auVar100._0_4_ = uVar2;
            auVar100._8_4_ = uVar2;
            auVar100._12_4_ = uVar2;
            fVar43 = (ray->dir).field_0.m128[1];
            local_9e8 = vsubps_avx(auVar51,auVar46);
            fVar48 = (ray->dir).field_0.m128[2];
            auVar75 = vsubps_avx(auVar72,auVar94);
            auVar44 = vsubps_avx(auVar79,auVar100);
            fVar10 = auVar44._0_4_;
            auVar95._0_4_ = fVar43 * fVar10;
            fVar16 = auVar44._4_4_;
            auVar95._4_4_ = fVar43 * fVar16;
            fVar22 = auVar44._8_4_;
            auVar95._8_4_ = fVar43 * fVar22;
            fVar28 = auVar44._12_4_;
            auVar95._12_4_ = fVar43 * fVar28;
            fVar11 = auVar75._0_4_;
            auVar101._0_4_ = fVar48 * fVar11;
            fVar17 = auVar75._4_4_;
            auVar101._4_4_ = fVar48 * fVar17;
            fVar23 = auVar75._8_4_;
            auVar101._8_4_ = fVar48 * fVar23;
            fVar29 = auVar75._12_4_;
            auVar101._12_4_ = fVar48 * fVar29;
            auVar44 = vsubps_avx(auVar101,auVar95);
            fVar49 = (ray->dir).field_0.m128[0];
            fVar12 = local_9e8._0_4_;
            auVar47._0_4_ = fVar48 * fVar12;
            fVar18 = local_9e8._4_4_;
            auVar47._4_4_ = fVar48 * fVar18;
            fVar24 = local_9e8._8_4_;
            auVar47._8_4_ = fVar48 * fVar24;
            fVar30 = local_9e8._12_4_;
            auVar47._12_4_ = fVar48 * fVar30;
            auVar56._0_4_ = fVar49 * fVar10;
            auVar56._4_4_ = fVar49 * fVar16;
            auVar56._8_4_ = fVar49 * fVar22;
            auVar56._12_4_ = fVar49 * fVar28;
            auVar78 = vsubps_avx(auVar56,auVar47);
            auVar57._0_4_ = fVar49 * fVar11;
            auVar57._4_4_ = fVar49 * fVar17;
            auVar57._8_4_ = fVar49 * fVar23;
            auVar57._12_4_ = fVar49 * fVar29;
            auVar67._0_4_ = fVar43 * fVar12;
            auVar67._4_4_ = fVar43 * fVar18;
            auVar67._8_4_ = fVar43 * fVar24;
            auVar67._12_4_ = fVar43 * fVar30;
            auVar71 = vsubps_avx(auVar67,auVar57);
            auVar72 = local_a18;
            auVar68._0_4_ =
                 fVar49 * local_808._0_4_ + fVar43 * local_7f8._0_4_ + fVar48 * local_a18._0_4_;
            auVar68._4_4_ =
                 fVar49 * local_808._4_4_ + fVar43 * local_7f8._4_4_ + fVar48 * local_a18._4_4_;
            auVar68._8_4_ =
                 fVar49 * local_808._8_4_ + fVar43 * local_7f8._8_4_ + fVar48 * local_a18._8_4_;
            auVar68._12_4_ =
                 fVar49 * local_808._12_4_ + fVar43 * local_7f8._12_4_ + fVar48 * local_a18._12_4_;
            auVar58._8_8_ = 0x8000000080000000;
            auVar58._0_8_ = 0x8000000080000000;
            auVar75 = vandps_avx(auVar68,auVar58);
            uVar36 = auVar75._0_4_;
            local_898._0_4_ =
                 (float)(uVar36 ^ (uint)(fVar9 * auVar44._0_4_ +
                                        fVar77 * auVar78._0_4_ + fVar50 * auVar71._0_4_));
            uVar89 = auVar75._4_4_;
            local_898._4_4_ =
                 (float)(uVar89 ^ (uint)(fVar15 * auVar44._4_4_ +
                                        fVar14 * auVar78._4_4_ + fVar13 * auVar71._4_4_));
            uVar90 = auVar75._8_4_;
            local_898._8_4_ =
                 (float)(uVar90 ^ (uint)(fVar21 * auVar44._8_4_ +
                                        fVar20 * auVar78._8_4_ + fVar19 * auVar71._8_4_));
            uVar91 = auVar75._12_4_;
            local_898._12_4_ =
                 (float)(uVar91 ^ (uint)(fVar27 * auVar44._12_4_ +
                                        fVar26 * auVar78._12_4_ + fVar25 * auVar71._12_4_));
            local_888._0_4_ =
                 (float)(uVar36 ^ (uint)(auVar44._0_4_ * fVar93 +
                                        auVar78._0_4_ * fVar99 + fVar83 * auVar71._0_4_));
            local_888._4_4_ =
                 (float)(uVar89 ^ (uint)(auVar44._4_4_ * fVar96 +
                                        auVar78._4_4_ * fVar102 + fVar85 * auVar71._4_4_));
            local_888._8_4_ =
                 (float)(uVar90 ^ (uint)(auVar44._8_4_ * fVar97 +
                                        auVar78._8_4_ * fVar103 + fVar86 * auVar71._8_4_));
            local_888._12_4_ =
                 (float)(uVar91 ^ (uint)(auVar44._12_4_ * fVar98 +
                                        auVar78._12_4_ * fVar104 + fVar87 * auVar71._12_4_));
            auVar78 = ZEXT416(0) << 0x20;
            auVar75 = vcmpps_avx(local_898,auVar78,5);
            auVar44 = vcmpps_avx(local_888,auVar78,5);
            auVar75 = vandps_avx(auVar75,auVar44);
            auVar59._8_4_ = 0x7fffffff;
            auVar59._0_8_ = 0x7fffffff7fffffff;
            auVar59._12_4_ = 0x7fffffff;
            local_868 = vandps_avx(auVar68,auVar59);
            auVar44 = vcmpps_avx(auVar78,auVar68,4);
            auVar75 = vandps_avx(auVar75,auVar44);
            auVar60._0_4_ = local_898._0_4_ + local_888._0_4_;
            auVar60._4_4_ = local_898._4_4_ + local_888._4_4_;
            auVar60._8_4_ = local_898._8_4_ + local_888._8_4_;
            auVar60._12_4_ = local_898._12_4_ + local_888._12_4_;
            auVar44 = vcmpps_avx(auVar60,local_868,2);
            auVar75 = vandps_avx(auVar75,auVar44);
            auVar44 = local_948 & auVar75;
            if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar44[0xf] < '\0') {
              auVar75 = vandps_avx(auVar75,local_948);
              local_878._0_4_ =
                   (float)(uVar36 ^ (uint)(local_808._0_4_ * fVar12 +
                                          local_7f8._0_4_ * fVar11 + fVar10 * local_a18._0_4_));
              local_878._4_4_ =
                   (float)(uVar89 ^ (uint)(local_808._4_4_ * fVar18 +
                                          local_7f8._4_4_ * fVar17 + fVar16 * local_a18._4_4_));
              local_878._8_4_ =
                   (float)(uVar90 ^ (uint)(local_808._8_4_ * fVar24 +
                                          local_7f8._8_4_ * fVar23 + fVar22 * local_a18._8_4_));
              local_878._12_4_ =
                   (float)(uVar91 ^ (uint)(local_808._12_4_ * fVar30 +
                                          local_7f8._12_4_ * fVar29 + fVar28 * local_a18._12_4_));
              fVar43 = (ray->org).field_0.m128[3];
              fVar48 = local_868._0_4_;
              auVar61._0_4_ = fVar48 * fVar43;
              fVar49 = local_868._4_4_;
              auVar61._4_4_ = fVar49 * fVar43;
              fVar50 = local_868._8_4_;
              auVar61._8_4_ = fVar50 * fVar43;
              fVar77 = local_868._12_4_;
              auVar61._12_4_ = fVar77 * fVar43;
              auVar44 = vcmpps_avx(auVar61,local_878,1);
              fVar43 = ray->tfar;
              auVar69._0_4_ = fVar48 * fVar43;
              auVar69._4_4_ = fVar49 * fVar43;
              auVar69._8_4_ = fVar50 * fVar43;
              auVar69._12_4_ = fVar77 * fVar43;
              auVar78 = vcmpps_avx(local_878,auVar69,2);
              auVar44 = vandps_avx(auVar78,auVar44);
              local_848 = vandps_avx(auVar44,auVar75);
              uVar36 = vmovmskps_avx(local_848);
              if (uVar36 != 0) {
                local_7e8 = local_a18._0_8_;
                uStack_7e0 = local_a18._8_8_;
                auVar75 = vrcpps_avx(local_868);
                fVar43 = auVar75._0_4_;
                auVar62._0_4_ = fVar48 * fVar43;
                fVar48 = auVar75._4_4_;
                auVar62._4_4_ = fVar49 * fVar48;
                fVar49 = auVar75._8_4_;
                auVar62._8_4_ = fVar50 * fVar49;
                fVar50 = auVar75._12_4_;
                auVar62._12_4_ = fVar77 * fVar50;
                auVar70._8_4_ = 0x3f800000;
                auVar70._0_8_ = 0x3f8000003f800000;
                auVar70._12_4_ = 0x3f800000;
                auVar75 = vsubps_avx(auVar70,auVar62);
                fVar43 = fVar43 + fVar43 * auVar75._0_4_;
                fVar48 = fVar48 + fVar48 * auVar75._4_4_;
                fVar49 = fVar49 + fVar49 * auVar75._8_4_;
                fVar50 = fVar50 + fVar50 * auVar75._12_4_;
                local_818[0] = fVar43 * local_878._0_4_;
                local_818[1] = fVar48 * local_878._4_4_;
                local_818[2] = fVar49 * local_878._8_4_;
                local_818[3] = fVar50 * local_878._12_4_;
                local_838._0_4_ = fVar43 * local_898._0_4_;
                local_838._4_4_ = fVar48 * local_898._4_4_;
                local_838._8_4_ = fVar49 * local_898._8_4_;
                local_838._12_4_ = fVar50 * local_898._12_4_;
                local_828._0_4_ = fVar43 * local_888._0_4_;
                local_828._4_4_ = fVar48 * local_888._4_4_;
                local_828._8_4_ = fVar49 * local_888._8_4_;
                local_828._12_4_ = fVar50 * local_888._12_4_;
                local_9c0 = (ulong)(uVar36 & 0xff);
                local_a18 = auVar72;
                do {
                  local_9c8 = 0;
                  if (local_9c0 != 0) {
                    for (; (local_9c0 >> local_9c8 & 1) == 0; local_9c8 = local_9c8 + 1) {
                    }
                  }
                  local_990 = *(uint *)((long)&local_8a8 + local_9c8 * 4);
                  local_9d0 = (local_a20->geometries).items[local_990].ptr;
                  if ((local_9d0->mask & ray->mask) == 0) {
                    local_9c0 = local_9c0 ^ 1L << (local_9c8 & 0x3f);
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (local_9d0->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002becc4;
                    local_9f8._0_8_ = context->args;
                    local_9e8._0_8_ = uVar39;
                    local_a18._0_8_ = puVar38;
                    local_978.context = context->user;
                    local_9a8 = *(undefined4 *)(local_808 + local_9c8 * 4);
                    local_9a4 = *(undefined4 *)(local_7f8 + local_9c8 * 4);
                    local_9a0 = *(undefined4 *)((long)&local_7e8 + local_9c8 * 4);
                    local_99c = *(undefined4 *)(local_838 + local_9c8 * 4);
                    local_998 = local_818[local_9c8 - 4];
                    local_994 = *(undefined4 *)((long)&local_8b8 + local_9c8 * 4);
                    local_98c = (local_978.context)->instID[0];
                    local_988 = (local_978.context)->instPrimID[0];
                    fVar43 = ray->tfar;
                    ray->tfar = local_818[local_9c8];
                    local_a24 = -1;
                    local_978.valid = &local_a24;
                    local_978.geometryUserPtr = local_9d0->userPtr;
                    local_a08._0_8_ = ray;
                    local_978.hit = (RTCHitN *)&local_9a8;
                    local_978.N = 1;
                    local_978.ray = (RTCRayN *)ray;
                    if ((local_9d0->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*local_9d0->occlusionFilterN)(&local_978), *local_978.valid != 0)) {
                      ray = (Ray *)local_a08._0_8_;
                      if ((*(code **)(local_9f8._0_8_ + 0x10) == (code *)0x0) ||
                         (((*(byte *)local_9f8._0_8_ & 2) == 0 &&
                          (((local_9d0->field_8).field_0x2 & 0x40) == 0)))) {
LAB_002becc4:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      (**(code **)(local_9f8._0_8_ + 0x10))(&local_978);
                      ray = (Ray *)local_a08._0_8_;
                      if (*local_978.valid != 0) goto LAB_002becc4;
                    }
                    *(float *)(local_a08._0_8_ + 0x20) = fVar43;
                    local_9c0 = local_9c0 ^ 1L << (local_9c8 & 0x3f);
                    ray = (Ray *)local_a08._0_8_;
                    puVar38 = (ulong *)local_a18._0_8_;
                    uVar39 = local_9e8._0_8_;
                  }
                } while (local_9c0 != 0);
              }
            }
            local_9b8 = local_9b8 + 1;
          } while (local_9b8 != local_9b0);
        }
        auVar81 = ZEXT1664(local_8c8);
        auVar82 = ZEXT1664(local_8d8);
        auVar84 = ZEXT1664(local_8e8);
        auVar88 = ZEXT1664(local_8f8);
        auVar92 = ZEXT1664(local_908);
        auVar74 = ZEXT1664(local_918);
        auVar76 = ZEXT1664(local_928);
        auVar80 = ZEXT1664(local_938);
      } while (puVar38 != &local_7d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }